

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netmin.cpp
# Opt level: O0

void __thiscall NetworkNS::NetwMin::NetwMin(NetwMin *this,string *filename)

{
  Domain *pDVar1;
  Network *this_00;
  RanMars *this_01;
  dump *this_02;
  Grid *this_03;
  allocator<char> local_91;
  string local_90;
  undefined1 local_69;
  string local_68;
  undefined1 local_45;
  string local_38;
  string *local_18;
  string *filename_local;
  NetwMin *this_local;
  
  local_18 = filename;
  filename_local = (string *)this;
  pDVar1 = (Domain *)operator_new(0xa0);
  local_45 = 1;
  std::__cxx11::string::string((string *)&local_38,(string *)filename);
  Domain::Domain(pDVar1,&local_38);
  local_45 = 0;
  this->domain = pDVar1;
  std::__cxx11::string::~string((string *)&local_38);
  std::operator<<((ostream *)&std::cout,"#: Domain characteristics have been read.\n");
  this_00 = (Network *)operator_new(0xb0);
  local_69 = 1;
  std::__cxx11::string::string((string *)&local_68,(string *)filename);
  Network::Network(this_00,this,&local_68);
  local_69 = 0;
  this->network = this_00;
  std::__cxx11::string::~string((string *)&local_68);
  std::operator<<((ostream *)&std::cout,"#: Network has been read.\n");
  this_01 = (RanMars *)operator_new(0x30);
  RanMars::RanMars(this_01,0x2b67);
  this->my_rnd_gen = this_01;
  std::operator<<((ostream *)&std::cout,"#: Particles have been read.\n");
  this_02 = (dump *)operator_new(0x208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"dump_b3D.lammpstrj",&local_91);
  dump::dump(this_02,&local_90);
  this->my_traj_file = this_02;
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::operator<<((ostream *)&std::cout,
                  "#: \'dump_b3D.lammpstrj\' will be used as trajectory file.\n");
  this_03 = (Grid *)operator_new(0x60);
  pDVar1 = this->domain;
  Grid::Grid(this_03,pDVar1->XBoxLen,pDVar1->YBoxLen,pDVar1->ZBoxLen,5,5,5);
  this->grid = this_03;
  write_network_to_lammps_data_file(this);
  return;
}

Assistant:

NetwMin::NetwMin(std::string filename){
      
      domain = new Domain(filename);
      cout << "#: Domain characteristics have been read.\n";
      network = new Network(this,filename);
      cout << "#: Network has been read.\n";
      my_rnd_gen = new RanMars(11111);
      
      cout << "#: Particles have been read.\n";
      
      my_traj_file = new dump("dump_b3D.lammpstrj");
      cout << "#: 'dump_b3D.lammpstrj' will be used as trajectory file.\n";
   
      grid = new Grid(domain->XBoxLen, domain->YBoxLen, domain->ZBoxLen, 5, 5, 5);
      write_network_to_lammps_data_file();
      
      return;
   }